

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editorrenderer.cpp
# Opt level: O2

int __thiscall EditorRenderer::handle(EditorRenderer *this,int e)

{
  int iVar1;
  Fl_Cursor c;
  
  iVar1 = Fl_Gl_Window::handle(&this->super_Fl_Gl_Window,e);
  if (e == 2) {
    if (Fl::e_keysym != 0xfeeb) {
      return iVar1;
    }
    this->dragging = false;
    c = FL_CURSOR_DEFAULT;
  }
  else {
    if (e != 1) {
      return iVar1;
    }
    if (Fl::e_keysym != 0xfeeb) {
      return iVar1;
    }
    this->dragging = true;
    this->lockedMouseX = Fl::e_x_root;
    this->lockedMouseY = Fl::e_y_root;
    c = FL_CURSOR_NONE;
  }
  Fl_Window::cursor(this->mainWindow,c);
  return iVar1;
}

Assistant:

int EditorRenderer::handle(int e)
{
	int ret = Fl_Gl_Window::handle(e);

	if (e == FL_PUSH && Fl::event_button() == 3)
	{
		dragging = true;
		lockedMouseX = Fl::event_x_root();
		lockedMouseY = Fl::event_y_root();
		mainWindow->cursor(FL_CURSOR_NONE);

	}
	else if (e == FL_RELEASE && Fl::event_button() == 3)
	{
		dragging = false;
		mainWindow->cursor(FL_CURSOR_DEFAULT);
	}


	return ret;
}